

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

string * __thiscall
Json::valueToString_abi_cxx11_(string *__return_storage_ptr__,Json *this,bool value)

{
  char *pcVar1;
  allocator local_12;
  byte local_11;
  string *psStack_10;
  bool value_local;
  
  local_11 = (byte)this & 1;
  pcVar1 = "false";
  if (((ulong)this & 1) != 0) {
    pcVar1 = "true";
  }
  psStack_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_12);
  std::allocator<char>::~allocator((allocator<char> *)&local_12);
  return __return_storage_ptr__;
}

Assistant:

std::string valueToString(bool value) { return value ? "true" : "false"; }